

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

void Fx_ManDivFindPivots(Vec_Int_t *vDiv,int *pLit0,int *pLit1)

{
  int iVar1;
  int iVar2;
  int local_24;
  int Lit;
  int i;
  int *pLit1_local;
  int *pLit0_local;
  Vec_Int_t *vDiv_local;
  
  *pLit0 = -1;
  *pLit1 = -1;
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vDiv);
    if (iVar1 <= local_24) {
      return;
    }
    iVar1 = Vec_IntEntry(vDiv,local_24);
    iVar2 = Abc_LitIsCompl(iVar1);
    if (iVar2 == 0) {
      if (*pLit0 == -1) {
        iVar1 = Abc_Lit2Var(iVar1);
        *pLit0 = iVar1;
      }
    }
    else if (*pLit1 == -1) {
      iVar1 = Abc_Lit2Var(iVar1);
      *pLit1 = iVar1;
    }
    if ((-1 < *pLit0) && (-1 < *pLit1)) break;
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

static inline void Fx_ManDivFindPivots( Vec_Int_t * vDiv, int * pLit0, int * pLit1 )
{
    int i, Lit;
    *pLit0 = -1;
    *pLit1 = -1;
    Vec_IntForEachEntry( vDiv, Lit, i )
    {
        if ( Abc_LitIsCompl(Lit) )
        {
            if ( *pLit1 == -1 )
                *pLit1 = Abc_Lit2Var(Lit);
        }
        else
        {
            if ( *pLit0 == -1 )
                *pLit0 = Abc_Lit2Var(Lit);
        }
        if ( *pLit0 >= 0 && *pLit1 >= 0 )
            return;
    }
}